

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O2

void diy::detail::recv_req
               (AuxBlock *param_1,ProxyWithLink *cp,vector<int,_std::allocator<int>_> *req_procs)

{
  MemoryBuffer *pMVar1;
  mapped_type *pmVar2;
  int i;
  ulong uVar3;
  int gid;
  int local_50;
  int v;
  vector<int,_std::allocator<int>_> incoming_gids;
  
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Master::Proxy::incoming(&cp->super_Proxy,&incoming_gids);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    gid = incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
    pMVar1 = Master::Proxy::incoming(&cp->super_Proxy,gid);
    if ((pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_50 = gid;
      pmVar2 = std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](&(cp->super_Proxy).incoming_,&local_50);
      (*(pmVar2->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar2,&v,4);
      std::vector<int,_std::allocator<int>_>::push_back(req_procs,&gid);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&incoming_gids.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

inline void recv_req(AuxBlock*,                                // local block (unused)
              const diy::Master::ProxyWithLink& cp,     // communication proxy for neighbor blocks
              std::vector<int>& req_procs)              // processes requesting work info
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            int v;
            cp.dequeue(gid, v);
            req_procs.push_back(gid);                   // aux_master has 1 gid per proc, so gid = proc
        }
    }
}